

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

void __thiscall
chrono::ChOptimizerGenetic::PopulationStats
          (ChOptimizerGenetic *this,double *average,double *max,double *min,double *stdeviation)

{
  int iVar1;
  ChGenotype **ppCVar2;
  ChGenotype *pCVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  iVar6 = 0;
  *average = 0.0;
  *max = -999999999.0;
  *min = 999999999.0;
  *stdeviation = 0.0;
  iVar1 = *(int *)&(this->super_ChOptimizer).field_0x144;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    ppCVar2 = this->population;
    lVar8 = 0;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    iVar6 = 0;
    do {
      pCVar3 = ppCVar2[lVar8];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pCVar3->fitness;
      auVar14 = vandpd_avx(auVar14,auVar11);
      if ((auVar14._0_8_ != 999999.0) || (NAN(auVar14._0_8_))) {
        *average = pCVar3->fitness + *average;
        if (*max < pCVar3->fitness) {
          *max = pCVar3->fitness;
        }
        iVar6 = iVar6 + 1;
        if (pCVar3->fitness < *min) {
          *min = pCVar3->fitness;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  dVar10 = *average;
  *average = dVar10 / (double)iVar6;
  dVar9 = 0.0;
  dVar13 = 0.0;
  if (0 < iVar1) {
    lVar8 = 0;
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    do {
      dVar13 = this->population[lVar8]->fitness;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar13;
      auVar11 = vandpd_avx(auVar16,auVar15);
      dVar13 = dVar13 - dVar10 / (double)iVar6;
      uVar4 = vcmpsd_avx512f(auVar11,ZEXT816(0x412e847e00000000),4);
      bVar5 = (bool)((byte)uVar4 & 1);
      dVar9 = (double)((ulong)bVar5 * (long)(dVar9 + dVar13 * dVar13) + (ulong)!bVar5 * (long)dVar9)
      ;
      lVar8 = lVar8 + 1;
      dVar13 = dVar9;
    } while (lVar7 != lVar8);
  }
  auVar12._0_8_ = dVar13 / (double)(iVar6 + -1);
  auVar12._8_8_ = 0;
  if (auVar12._0_8_ < 0.0) {
    dVar10 = sqrt(auVar12._0_8_);
  }
  else {
    auVar11 = vsqrtsd_avx(auVar12,auVar12);
    dVar10 = auVar11._0_8_;
  }
  *stdeviation = dVar10;
  return;
}

Assistant:

void ChOptimizerGenetic::PopulationStats(double& average, double& max, double& min, double& stdeviation) {
    average = 0;
    max = -999999999;
    min = +999999999;
    stdeviation = 0;
    double variance = 0;
    int i;
    int sumind = 0;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            sumind++;
            average += population[i]->fitness;
            if (population[i]->fitness > max)
                max = population[i]->fitness;
            if (population[i]->fitness < min)
                min = population[i]->fitness;
        }
    }
    average = average / (double)sumind;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            variance += pow((population[i]->fitness - average), 2);
        }
    }
    variance = variance / (double)(sumind - 1);
    stdeviation = sqrt(variance);
}